

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlstring(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xmlstring : 26 of 30 functions ...\n");
  }
  iVar1 = test_xmlCharStrdup();
  iVar2 = test_xmlCharStrndup();
  iVar3 = test_xmlCheckUTF8();
  iVar4 = test_xmlGetUTF8Char();
  iVar5 = test_xmlStrEqual();
  iVar6 = test_xmlStrPrintf();
  iVar7 = test_xmlStrQEqual();
  iVar8 = test_xmlStrVPrintf();
  iVar9 = test_xmlStrcasecmp();
  iVar10 = test_xmlStrcasestr();
  iVar11 = test_xmlStrchr();
  iVar12 = test_xmlStrcmp();
  iVar13 = test_xmlStrdup();
  iVar14 = test_xmlStrlen();
  iVar15 = test_xmlStrncasecmp();
  iVar16 = test_xmlStrncatNew();
  iVar17 = test_xmlStrncmp();
  iVar18 = test_xmlStrndup();
  iVar19 = test_xmlStrstr();
  iVar20 = test_xmlStrsub();
  iVar21 = test_xmlUTF8Charcmp();
  iVar22 = test_xmlUTF8Size();
  iVar23 = test_xmlUTF8Strlen();
  iVar24 = test_xmlUTF8Strloc();
  iVar25 = test_xmlUTF8Strndup();
  iVar26 = test_xmlUTF8Strpos();
  iVar27 = test_xmlUTF8Strsize();
  iVar28 = test_xmlUTF8Strsub();
  uVar29 = iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + iVar23 + iVar22 + iVar21 + iVar20 + iVar19 +
                                                                                            iVar18 +
                                                                                            iVar17 +
                                                                                            iVar16 +
                                                                                            iVar15 +
                                                                                            iVar14 +
                                                                                            iVar13 +
                                                                                            iVar12 +
                                                                                            iVar11 +
                                                                                            iVar10 +
                                                                                            iVar9 + 
                                                  iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + 
                                                  iVar2 + iVar1;
  if (uVar29 != 0) {
    printf("Module xmlstring: %d errors\n",(ulong)uVar29);
  }
  return uVar29;
}

Assistant:

static int
test_xmlstring(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlstring : 26 of 30 functions ...\n");
    test_ret += test_xmlCharStrdup();
    test_ret += test_xmlCharStrndup();
    test_ret += test_xmlCheckUTF8();
    test_ret += test_xmlGetUTF8Char();
    test_ret += test_xmlStrEqual();
    test_ret += test_xmlStrPrintf();
    test_ret += test_xmlStrQEqual();
    test_ret += test_xmlStrVPrintf();
    test_ret += test_xmlStrcasecmp();
    test_ret += test_xmlStrcasestr();
    test_ret += test_xmlStrchr();
    test_ret += test_xmlStrcmp();
    test_ret += test_xmlStrdup();
    test_ret += test_xmlStrlen();
    test_ret += test_xmlStrncasecmp();
    test_ret += test_xmlStrncatNew();
    test_ret += test_xmlStrncmp();
    test_ret += test_xmlStrndup();
    test_ret += test_xmlStrstr();
    test_ret += test_xmlStrsub();
    test_ret += test_xmlUTF8Charcmp();
    test_ret += test_xmlUTF8Size();
    test_ret += test_xmlUTF8Strlen();
    test_ret += test_xmlUTF8Strloc();
    test_ret += test_xmlUTF8Strndup();
    test_ret += test_xmlUTF8Strpos();
    test_ret += test_xmlUTF8Strsize();
    test_ret += test_xmlUTF8Strsub();

    if (test_ret != 0)
	printf("Module xmlstring: %d errors\n", test_ret);
    return(test_ret);
}